

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O1

void handle_accept(cio_server_socket *server_socket,void *handler_context,cio_error err,
                  cio_socket *socket)

{
  cio_socket_impl *pcVar1;
  cio_io_stream_write_handler_t *buffered_stream;
  cio_error cVar2;
  cio_io_stream *stream;
  
  if (err == CIO_SUCCESS) {
    pcVar1 = &socket[1].impl;
    socket[1].stream.write_handler_context = pcVar1;
    socket[1].close_hook = (cio_socket_close_hook_t)&socket[2].stream.write_some;
    socket[1].handler_context = pcVar1;
    socket[1].handler = (cio_connect_handler_t)pcVar1;
    stream = cio_socket_get_io_stream(socket);
    buffered_stream = &socket[-1].stream.write_handler;
    cVar2 = cio_buffered_stream_init((cio_buffered_stream *)buffered_stream,stream);
    if (cVar2 == CIO_SUCCESS) {
      cVar2 = cio_buffered_stream_read_at_least
                        ((cio_buffered_stream *)buffered_stream,
                         (cio_read_buffer *)&socket[1].stream.write_handler_context,6,
                         server_handle_read,&socket[-1].stream.write_buffer);
      if (cVar2 == CIO_SUCCESS) {
        return;
      }
      handle_accept_cold_3();
    }
    else {
      handle_accept_cold_2();
    }
  }
  else {
    handle_accept_cold_1();
  }
  cio_server_socket_close(server_socket);
  cio_eventloop_cancel((server_socket->impl).loop);
  return;
}

Assistant:

static void handle_accept(struct cio_server_socket *server_socket, void *handler_context, enum cio_error err, struct cio_socket *socket)
{
	(void)handler_context;

	struct echo_client *client = cio_container_of(socket, struct echo_client, socket);

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "accept error!\n");
		goto error;
	}

	err = cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init read buffer!\n");
		goto error;
	}

	struct cio_io_stream *stream = cio_socket_get_io_stream(socket);

	struct cio_buffered_stream *buffered_stream = &client->buffered_stream;
	err = cio_buffered_stream_init(buffered_stream, stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init buffered stream!\n");
		goto error;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), server_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		goto error;
	}

	return;

error:
	cio_server_socket_close(server_socket);
	cio_eventloop_cancel(server_socket->impl.loop);
}